

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensor.cpp
# Opt level: O0

void __thiscall Sensor::Sensor(Sensor *this,string *name,VectorXd *noise,int df,int debug)

{
  int debug_local;
  int df_local;
  VectorXd *noise_local;
  string *name_local;
  Sensor *this_local;
  
  this->_vptr_Sensor = (_func_int **)&PTR__Sensor_002d4c48;
  std::__cxx11::string::string((string *)&this->name_,(string *)name);
  this->df_ = df;
  this->debug_ = debug;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->R_);
  SetR(this,noise);
  return;
}

Assistant:

Sensor::Sensor(string name, const VectorXd& noise, int df, int debug) :
	name_(name),
	df_(df),
	debug_(debug)
{
    SetR(noise);
}